

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int vs_ue(bitstream *str,uint32_t *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint size;
  uint32_t tmp;
  uint32_t local_2c;
  
  if (str->dir == VS_ENCODE) {
    local_2c = 0;
    if (*val == 0xffffffff) {
      vs_ue_cold_2();
      iVar3 = 1;
    }
    else {
      iVar1 = 0;
      iVar3 = 1;
      do {
        if (*val < (2 << ((byte)iVar1 & 0x1f)) - 1U) {
          local_2c = 1;
          iVar3 = vs_u(str,&local_2c,1);
          if (iVar3 != 0) {
            return 1;
          }
          local_2c = (-1 << ((byte)iVar1 & 0x1f)) + *val + 1;
          iVar3 = vs_u(str,&local_2c,iVar1);
          return iVar3;
        }
        iVar1 = iVar1 + 1;
        iVar2 = vs_u(str,&local_2c,1);
      } while (iVar2 == 0);
    }
  }
  else {
    size = 0xffffffff;
    iVar3 = 1;
    do {
      iVar1 = vs_u(str,&local_2c,1);
      if (iVar1 != 0) {
        return 1;
      }
      size = size + 1;
    } while (local_2c == 0);
    if (size < 0x20) {
      iVar1 = vs_u(str,&local_2c,size);
      if (iVar1 == 0) {
        *val = ~(-1 << ((byte)size & 0x1f)) + local_2c;
        iVar3 = 0;
      }
    }
    else {
      vs_ue_cold_1();
    }
  }
  return iVar3;
}

Assistant:

int vs_ue(struct bitstream *str, uint32_t *val) {
	int lzb = 0;
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		tmp = 0;
		if (*val >= (uint32_t)0xffffffff) {
			fprintf (stderr, "Exp-Golomb number larger than 2^32-2\n");
			return 1;
		}
		while (*val >= (uint32_t)(1u << (lzb + 1)) - 1) {
			if (vs_u(str, &tmp, 1))
				return 1;
			lzb++;
		}
		tmp = 1;
		if (vs_u(str, &tmp, 1))
			return 1;
		tmp = *val - ((1 << lzb) - 1);
		if (vs_u(str, &tmp, lzb))
			return 1;
		return 0;
	} else {
		do {
			if (vs_u(str, &tmp, 1))
				return 1;
			lzb++;
		} while (!tmp);
		lzb--;
		if (lzb > 31) {
			fprintf (stderr, "Exp-Golomb number larger than 2^32-2\n");
			return 1;
		}
		if (vs_u(str, &tmp, lzb))
			return 1;
		*val = tmp + (1u << lzb) - 1;
		return 0;
	}
}